

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void CompareOnTheFlyBone(comparer_context *comp)

{
  scoped_chunk sVar1;
  allocator<char> local_501;
  string local_500;
  aiMatrix4x4 local_4dc;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  aiString local_450;
  allocator<char> local_39;
  string local_38;
  scoped_chunk local_18;
  scoped_chunk chunk;
  comparer_context *comp_local;
  
  chunk.ctx = comp;
  scoped_chunk::scoped_chunk(&local_18,comp,"aiBone");
  sVar1.ctx = chunk.ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"mName",&local_39);
  comparer_context::cmp<aiString>(&local_450,sVar1.ctx,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"mNumWeights",&local_471);
  comparer_context::cmp<unsigned_int>(sVar1.ctx,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"mOffsetMatrix",&local_499);
  comparer_context::cmp<aiMatrix4x4t<float>>(&local_4dc,sVar1.ctx,&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"mWeights",&local_501);
  comparer_context::cmp_bounds<aiVertexWeight>(sVar1.ctx,&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  scoped_chunk::~scoped_chunk(&local_18);
  return;
}

Assistant:

void CompareOnTheFlyBone(comparer_context& comp)    {
    scoped_chunk chunk(comp,"aiBone");
    comp.cmp<aiString>("mName");
    comp.cmp<uint32_t>("mNumWeights");
    comp.cmp<aiMatrix4x4>("mOffsetMatrix");

    comp.cmp_bounds<aiVertexWeight>("mWeights");
}